

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

void __thiscall TasGrid::GridSequence::loadConstructedPoints(GridSequence *this)

{
  bool bVar1;
  pointer pSVar2;
  reference x;
  double *new_vals;
  undefined1 local_d8 [8];
  vector<double,_std::allocator<double>_> vals;
  MultiIndexSet local_b8;
  undefined1 local_90 [8];
  MultiIndexSet new_points;
  NodeData *d;
  iterator __end1;
  iterator __begin1;
  forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *__range1;
  Data2D<int> candidates;
  GridSequence *this_local;
  
  candidates.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  Data2D<int>::Data2D<int,int>
            ((Data2D<int> *)&__range1,(this->super_BaseCanonicalGrid).num_dimensions,0);
  pSVar2 = ::std::
           unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                         *)&this->dynamic_values);
  __end1._M_node =
       (_Fwd_list_node_base *)
       ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::begin
                 (&pSVar2->data);
  d = (NodeData *)
      ::std::forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>::end(&pSVar2->data)
  ;
  while( true ) {
    bVar1 = ::std::operator!=((_Self *)&__end1,(_Self *)&d);
    if (!bVar1) break;
    x = ::std::_Fwd_list_iterator<TasGrid::NodeData>::operator*
                  ((_Fwd_list_iterator<TasGrid::NodeData> *)&__end1);
    Data2D<int>::appendStrip((Data2D<int> *)&__range1,&x->point);
    ::std::_Fwd_list_iterator<TasGrid::NodeData>::operator++
              ((_Fwd_list_iterator<TasGrid::NodeData> *)&__end1);
  }
  MultiIndexSet::MultiIndexSet(&local_b8,(Data2D<int> *)&__range1);
  MultiIndexManipulations::getLargestCompletion
            ((MultiIndexSet *)local_90,&(this->super_BaseCanonicalGrid).points,&local_b8);
  MultiIndexSet::~MultiIndexSet(&local_b8);
  bVar1 = MultiIndexSet::empty((MultiIndexSet *)local_90);
  if (bVar1) {
    vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  else {
    clearGpuNodes(this);
    clearGpuSurpluses(this);
    pSVar2 = ::std::
             unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
             ::operator->((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
                           *)&this->dynamic_values);
    SimpleConstructData::extractValues
              ((vector<double,_std::allocator<double>_> *)local_d8,pSVar2,(MultiIndexSet *)local_90)
    ;
    bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
    if (bVar1) {
      MultiIndexSet::operator=(&(this->super_BaseCanonicalGrid).points,(MultiIndexSet *)local_90);
      StorageSet::setValues
                (&(this->super_BaseCanonicalGrid).values,
                 (vector<double,_std::allocator<double>_> *)local_d8);
    }
    else {
      new_vals = ::std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)local_d8);
      StorageSet::addValues
                (&(this->super_BaseCanonicalGrid).values,&(this->super_BaseCanonicalGrid).points,
                 (MultiIndexSet *)local_90,new_vals);
      MultiIndexSet::operator+=(&(this->super_BaseCanonicalGrid).points,(MultiIndexSet *)local_90);
    }
    prepareSequence(this,0);
    recomputeSurpluses(this);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_d8);
    vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
  }
  MultiIndexSet::~MultiIndexSet((MultiIndexSet *)local_90);
  Data2D<int>::~Data2D((Data2D<int> *)&__range1);
  return;
}

Assistant:

void GridSequence::loadConstructedPoints(){
    Data2D<int> candidates(num_dimensions, 0);
    for(auto &d : dynamic_values->data)
        candidates.appendStrip(d.point);
    auto new_points = MultiIndexManipulations::getLargestCompletion(points, MultiIndexSet(candidates));
    if (new_points.empty()) return;

    clearGpuNodes(); // the points will change, clear the cache
    clearGpuSurpluses();

    auto vals = dynamic_values->extractValues(new_points);
    if (points.empty()){
        points = std::move(new_points);
        values.setValues(std::move(vals));
    }else{
        values.addValues(points, new_points, vals.data());
        points += new_points;
    }
    prepareSequence(0); // update the directional max_levels, will not shrink the number of nodes
    recomputeSurpluses(); // costly, but the only option under the circumstances
}